

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O1

void __thiscall xray_re::xr_custom_object::save_v12(xr_custom_object *this,xr_ini_writer *w)

{
  pointer pcVar1;
  size_t in_RCX;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  long *local_40 [2];
  long local_30 [2];
  
  xr_ini_writer::write(w,0x1f1d02,(void *)(ulong)this->m_class_id,in_RCX);
  xr_ini_writer::write(w,0x1f1d08,(void *)(ulong)this->m_flags,in_RCX);
  xr_ini_writer::write(w,0x1e66ca,(void *)0x0,in_RCX);
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->m_name)._M_string_length);
  __n = 0;
  xr_ini_writer::write(w,0x1f01b6,(string *)local_40,0);
  __buf = extraout_RDX;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
    __buf = extraout_RDX_00;
  }
  xr_ini_writer::write(w,0x1f2742,__buf,__n);
  xr_ini_writer::write(w,0x1f1d11,__buf_00,__n);
  xr_ini_writer::write(w,0x1f1d1a,__buf_01,__n);
  return;
}

Assistant:

void xr_custom_object::save_v12(xr_ini_writer* w) const
{
	w->write("clsid", m_class_id);
	w->write("co_flags", m_flags);
	w->write("flags", 0);
	w->write("name", m_name, false);
	w->write("position", m_position);
	w->write("rotation", m_rotation);
	w->write("scale", m_scale);
}